

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

bool __thiscall ON_BezierCurve::IsValid(ON_BezierCurve *this)

{
  ON_BezierCurve *this_local;
  
  if (this->m_dim < 1) {
    this_local._7_1_ = false;
  }
  else if ((this->m_is_rat == 0) || (this->m_is_rat == 1)) {
    if (this->m_order < 2) {
      this_local._7_1_ = false;
    }
    else if (this->m_cv_stride < this->m_dim + this->m_is_rat) {
      this_local._7_1_ = false;
    }
    else if ((this->m_cv_capacity < 1) || (this->m_cv_stride * this->m_order <= this->m_cv_capacity)
            ) {
      if (this->m_cv == (double *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BezierCurve::IsValid() const
{
  if ( m_dim <= 0 )
    return false;
  if ( m_is_rat != 0 && m_is_rat != 1 )
    return false;
  if ( m_order < 2 )
    return false;
  if ( m_cv_stride < m_dim+m_is_rat )
    return false;
  if ( m_cv_capacity > 0 && m_cv_capacity < m_cv_stride*m_order )
    return false;
  if ( m_cv == nullptr )
    return false;
  return true;
}